

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  undefined8 uVar1;
  int iVar2;
  uint8 *puVar3;
  EpsCopyOutputStream *in_RDI;
  void *data;
  int size;
  uint8 *ptr;
  uint8 *local_78;
  int local_6c [25];
  uint8 *local_8;
  
  if (in_RDI->stream_ == (ZeroCopyOutputStream *)0x0) {
    local_8 = Error(in_RDI);
  }
  else if (in_RDI->buffer_end_ == (uint8 *)0x0) {
    *(undefined8 *)in_RDI->buffer_ = *(undefined8 *)in_RDI->end_;
    *(undefined8 *)(in_RDI->buffer_ + 8) = *(undefined8 *)(in_RDI->end_ + 8);
    in_RDI->buffer_end_ = in_RDI->end_;
    in_RDI->end_ = in_RDI->buffer_ + 0x10;
    local_8 = in_RDI->buffer_;
  }
  else {
    memcpy(in_RDI->buffer_end_,in_RDI->buffer_,(long)in_RDI->end_ - (long)in_RDI->buffer_);
    do {
      iVar2 = (*in_RDI->stream_->_vptr_ZeroCopyOutputStream[2])(in_RDI->stream_,&local_78,local_6c);
      if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
        puVar3 = Error(in_RDI);
        return puVar3;
      }
    } while (local_6c[0] == 0);
    if (local_6c[0] < 0x11) {
      uVar1 = *(undefined8 *)(in_RDI->end_ + 8);
      *(undefined8 *)in_RDI->buffer_ = *(undefined8 *)in_RDI->end_;
      *(undefined8 *)(in_RDI->buffer_ + 8) = uVar1;
      in_RDI->buffer_end_ = local_78;
      in_RDI->end_ = in_RDI->buffer_ + local_6c[0];
      local_8 = in_RDI->buffer_;
    }
    else {
      puVar3 = in_RDI->end_;
      *(undefined8 *)local_78 = *(undefined8 *)puVar3;
      *(undefined8 *)(local_78 + 8) = *(undefined8 *)(puVar3 + 8);
      in_RDI->end_ = local_78 + (long)local_6c[0] + -0x10;
      in_RDI->buffer_end_ = (uint8 *)0x0;
      local_8 = local_78;
    }
  }
  return local_8;
}

Assistant:

uint8* EpsCopyOutputStream::Next() {
  GOOGLE_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      GOOGLE_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}